

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_log.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::WriteLogFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunctionSet *in_RDI;
  ScalarFunctionSet *set;
  allocator_type *in_stack_fffffffffffffd58;
  ScalarFunction *function;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffd60;
  ScalarFunction *this;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  LogicalTypeId in_stack_fffffffffffffd7f;
  LogicalType *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd98;
  ScalarFunctionSet *in_stack_fffffffffffffda0;
  undefined1 **local_238;
  undefined1 *local_1b0 [3];
  undefined8 *local_198;
  undefined8 local_190;
  bind_scalar_function_extended_t in_stack_fffffffffffffe80;
  bind_scalar_function_t in_stack_fffffffffffffe88;
  scalar_function_t *in_stack_fffffffffffffe90;
  LogicalType *in_stack_fffffffffffffe98;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffea0;
  ScalarFunction *in_stack_fffffffffffffea8;
  function_statistics_t in_stack_fffffffffffffee0;
  init_local_state_t in_stack_fffffffffffffee8;
  LogicalType *in_stack_fffffffffffffef0;
  FunctionStability in_stack_fffffffffffffef8;
  FunctionNullHandling in_stack_ffffffffffffff00;
  bind_lambda_function_t in_stack_ffffffffffffff08;
  allocator local_31;
  string local_30 [39];
  undefined1 local_9;
  
  local_9 = 0;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_30,"write_log",&local_31);
  ScalarFunctionSet::ScalarFunctionSet(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  ::std::__cxx11::string::~string(local_30);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  LogicalType::LogicalType(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7f);
  local_198 = local_1b0;
  local_190 = 1;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x13df868);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffd70;
  iVar1._M_array = (iterator)in_stack_fffffffffffffd68;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffd74;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffd60,iVar1,in_stack_fffffffffffffd58);
  LogicalType::LogicalType(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7f);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
            );
  LogicalType::LogicalType(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7f);
  this = (ScalarFunction *)0x0;
  function = (ScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
             in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,in_stack_fffffffffffffef0,
             in_stack_fffffffffffffef8,in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,function);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x13df960);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x13df96d);
  LogicalType::~LogicalType((LogicalType *)0x13df97a);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x13df987);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x13df994);
  local_238 = (undefined1 **)&local_198;
  do {
    local_238 = local_238 + -3;
    LogicalType::~LogicalType((LogicalType *)0x13df9bd);
  } while (local_238 != local_1b0);
  return in_RDI;
}

Assistant:

ScalarFunctionSet WriteLogFun::GetFunctions() {
	ScalarFunctionSet set("write_log");

	set.AddFunction(ScalarFunction({LogicalType::VARCHAR}, LogicalType::ANY, WriteLogFunction, WriteLogBind, nullptr,
	                               nullptr, nullptr, LogicalType::ANY, FunctionStability::VOLATILE));

	return set;
}